

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O0

hash_iter_t * hash_table_iter_next(hash_iter_t *itor)

{
  bool bVar1;
  hash_iter_t *itor_local;
  
  if (itor->ent != (hash_entry_t *)0x0) {
    itor->ent = itor->ent->next;
  }
  itor_local = itor;
  if (itor->ent == (hash_entry_t *)0x0) {
    while( true ) {
      bVar1 = false;
      if (itor->idx < (ulong)(long)itor->ht->size) {
        bVar1 = itor->ht->table[itor->idx].key == (char *)0x0;
      }
      if (!bVar1) break;
      itor->idx = itor->idx + 1;
    }
    if (itor->idx == (long)itor->ht->size) {
      hash_table_iter_free(itor);
      itor_local = (hash_iter_t *)0x0;
    }
    else {
      itor->ent = itor->ht->table + itor->idx;
      itor->idx = itor->idx + 1;
    }
  }
  return itor_local;
}

Assistant:

hash_iter_t *
hash_table_iter_next(hash_iter_t *itor)
{
	/* If there is an entry, walk down its list. */
	if (itor->ent)
		itor->ent = itor->ent->next;
	/* If we got to the end of the chain, or we had no entry, scan
	 * forward in the table to find the next non-empty bucket. */
	if (itor->ent == NULL) {
		while (itor->idx < itor->ht->size
		       && itor->ht->table[itor->idx].key == NULL) 
			++itor->idx;
		/* If we did not find one then delete the iterator and
		 * return NULL. */
		if (itor->idx == itor->ht->size) {
			hash_table_iter_free(itor);
			return NULL;
		}
		/* Otherwise use this next entry. */
		itor->ent = itor->ht->table + itor->idx;
		/* Increase idx for the next time around. */
		++itor->idx;
	}
	return itor;
}